

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample.c
# Opt level: O3

SpeexResamplerState *
speex_resampler_init_frac
          (uint nb_channels,uint ratio_num,uint ratio_den,uint in_rate,uint out_rate,int quality,
          int *err)

{
  int iVar1;
  SpeexResamplerState *st;
  int *piVar2;
  uint *puVar3;
  size_t __nmemb;
  
  if ((ratio_den == 0 || (ratio_num == 0 || nb_channels == 0)) || 10 < (uint)quality) {
    if (err != (int *)0x0) {
      *err = 3;
    }
  }
  else {
    st = (SpeexResamplerState *)calloc(0x80,1);
    if (st == (SpeexResamplerState *)0x0) {
      if (err != (int *)0x0) {
        *err = 1;
      }
    }
    else {
      st->quality = -1;
      st->cutoff = 1.0;
      st->nb_channels = nb_channels;
      st->in_stride = 1;
      st->out_stride = 1;
      st->buffer_size = 0xa0;
      __nmemb = (size_t)(int)(nb_channels << 2);
      piVar2 = (int *)calloc(__nmemb,1);
      st->last_sample = piVar2;
      if (piVar2 != (int *)0x0) {
        puVar3 = (uint *)calloc(__nmemb,1);
        st->magic_samples = puVar3;
        if (puVar3 != (uint *)0x0) {
          puVar3 = (uint *)calloc(__nmemb,1);
          st->samp_frac_num = puVar3;
          if (puVar3 != (uint *)0x0) {
            st->quality = quality;
            speex_resampler_set_rate_frac(st,ratio_num,ratio_den,in_rate,out_rate);
            iVar1 = update_filter(st);
            if (iVar1 == 0) {
              st->initialised = 1;
            }
            else {
              speex_resampler_destroy(st);
              st = (SpeexResamplerState *)0x0;
            }
            if (err == (int *)0x0) {
              return st;
            }
            *err = iVar1;
            return st;
          }
        }
      }
      if (err != (int *)0x0) {
        *err = 1;
      }
      speex_resampler_destroy(st);
    }
  }
  return (SpeexResamplerState *)0x0;
}

Assistant:

EXPORT SpeexResamplerState *speex_resampler_init_frac(spx_uint32_t nb_channels, spx_uint32_t ratio_num, spx_uint32_t ratio_den, spx_uint32_t in_rate, spx_uint32_t out_rate, int quality, int *err)
{
   SpeexResamplerState *st;
   int filter_err;

   if (nb_channels == 0 || ratio_num == 0 || ratio_den == 0 || quality > 10 || quality < 0)
   {
      if (err)
         *err = RESAMPLER_ERR_INVALID_ARG;
      return NULL;
   }
   st = (SpeexResamplerState *)speex_alloc(sizeof(SpeexResamplerState));
   if (!st)
   {
      if (err)
         *err = RESAMPLER_ERR_ALLOC_FAILED;
      return NULL;
   }
   st->initialised = 0;
   st->started = 0;
   st->in_rate = 0;
   st->out_rate = 0;
   st->num_rate = 0;
   st->den_rate = 0;
   st->quality = -1;
   st->sinc_table_length = 0;
   st->mem_alloc_size = 0;
   st->filt_len = 0;
   st->mem = 0;
   st->resampler_ptr = 0;

   st->cutoff = 1.f;
   st->nb_channels = nb_channels;
   st->in_stride = 1;
   st->out_stride = 1;

   st->buffer_size = 160;

   /* Per channel data */
   if (!(st->last_sample = (spx_int32_t*)speex_alloc(nb_channels*sizeof(spx_int32_t))))
      goto fail;
   if (!(st->magic_samples = (spx_uint32_t*)speex_alloc(nb_channels*sizeof(spx_uint32_t))))
      goto fail;
   if (!(st->samp_frac_num = (spx_uint32_t*)speex_alloc(nb_channels*sizeof(spx_uint32_t))))
      goto fail;

   speex_resampler_set_quality(st, quality);
   speex_resampler_set_rate_frac(st, ratio_num, ratio_den, in_rate, out_rate);

   filter_err = update_filter(st);
   if (filter_err == RESAMPLER_ERR_SUCCESS)
   {
      st->initialised = 1;
   } else {
      speex_resampler_destroy(st);
      st = NULL;
   }
   if (err)
      *err = filter_err;

   return st;

fail:
   if (err)
      *err = RESAMPLER_ERR_ALLOC_FAILED;
   speex_resampler_destroy(st);
   return NULL;
}